

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgemm_nnos(int m,int n,int k,double *a,int lda,double *b,int ldb,double *c,int ldc)

{
  ulong uVar1;
  int k_;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double cij;
  double dVar6;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x10e,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x10f,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x110,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (a == c) {
    __assert_fail("a != c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x111,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == c) {
    __assert_fail("b != c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x112,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (m < 0) {
    __assert_fail("m >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x113,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x114,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (-1 < k) {
    if ((lda < 1) || (lda < k)) {
      __assert_fail("lda >= 1 && lda >= k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x116,
                    "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldb) && (n <= ldb)) {
      if ((0 < ldc) && (n <= ldc)) {
        for (uVar1 = 0; uVar1 != (uint)m; uVar1 = uVar1 + 1) {
          pdVar5 = b;
          for (uVar3 = 0; uVar3 != (uint)n; uVar3 = uVar3 + 1) {
            dVar6 = 0.0;
            pdVar4 = pdVar5;
            for (uVar2 = 0; (uint)k != uVar2; uVar2 = uVar2 + 1) {
              dVar6 = dVar6 + a[uVar2] * *pdVar4;
              pdVar4 = pdVar4 + (uint)ldb;
            }
            c[uVar1 * (uint)ldc + uVar3] = dVar6;
            pdVar5 = pdVar5 + 1;
          }
          a = a + (uint)lda;
        }
        return;
      }
      __assert_fail("ldc >= 1 && ldc >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x118,
                    "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    __assert_fail("ldb >= 1 && ldb >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x117,
                  "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("k >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x115,
                "void la_dgemm_nnos(int, int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemm_nnos(
        int m, int n, int k,
        const double *a, int lda,
        const double *b, int ldb,
        double *c, int ldc)
{
    assert(a);
    assert(b);
    assert(c);
    assert(a != c);
    assert(b != c);
    assert(m >= 0);
    assert(n >= 0);
    assert(k >= 0);
    assert(lda >= 1 && lda >= k);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);

    for (int i_ = 0; i_ < m; i_++) {
        for (int j_ = 0; j_ < n; j_++) {
            double cij = 0.0;
            for (int k_ = 0; k_ < k; k_++) {
                cij += a[i_ * lda + k_] * b[k_ * ldb + j_];
            }
            c[i_ * ldc + j_] = cij;
        }
    }
}